

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

long ftp_timeleft_accept(SessionHandle *data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  timeval local_20;
  
  lVar1 = (data->set).accepttimeout;
  lVar3 = 60000;
  if (0 < lVar1) {
    lVar3 = lVar1;
  }
  local_20 = curlx_tvnow();
  lVar1 = Curl_timeleft(data,&local_20,false);
  if (lVar1 == 0 || lVar3 <= lVar1) {
    lVar2 = curlx_tvdiff(local_20,(data->progress).t_acceptdata);
    lVar1 = -1;
    if (lVar3 - lVar2 != 0) {
      lVar1 = lVar3 - lVar2;
    }
  }
  return lVar1;
}

Assistant:

static long ftp_timeleft_accept(struct SessionHandle *data)
{
  long timeout_ms = DEFAULT_ACCEPT_TIMEOUT;
  long other;
  struct timeval now;

  if(data->set.accepttimeout > 0)
    timeout_ms = data->set.accepttimeout;

  now = Curl_tvnow();

  /* check if the generic timeout possibly is set shorter */
  other =  Curl_timeleft(data, &now, FALSE);
  if(other && (other < timeout_ms))
    /* note that this also works fine for when other happens to be negative
       due to it already having elapsed */
    timeout_ms = other;
  else {
    /* subtract elapsed time */
    timeout_ms -= Curl_tvdiff(now, data->progress.t_acceptdata);
    if(!timeout_ms)
      /* avoid returning 0 as that means no timeout! */
      return -1;
  }

  return timeout_ms;
}